

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Textures.cpp
# Opt level: O1

SP __thiscall pbrt::SemanticParser::createTexture_mix(SemanticParser *this,SP *in)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  element_type *this_00;
  element_type *this_01;
  element_type *this_02;
  element_type *peVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  long *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  float fVar8;
  SP SVar9;
  SP tex;
  string local_a8;
  element_type *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_80;
  undefined1 local_78 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Base_ptr local_48;
  _Base_ptr local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  
  local_88 = (element_type *)0x0;
  p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x80);
  p_Stack_80->_M_use_count = 1;
  p_Stack_80->_M_weak_count = 1;
  p_Stack_80->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00168350;
  local_88 = (element_type *)(p_Stack_80 + 1);
  p_Stack_80[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Stack_80[1]._M_use_count = 0;
  p_Stack_80[1]._M_weak_count = 0;
  p_Stack_80[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Stack_80[2]._M_use_count = 0;
  p_Stack_80[2]._M_weak_count = 0;
  p_Stack_80[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Stack_80[3]._M_use_count = 0;
  p_Stack_80[3]._M_weak_count = 0;
  p_Stack_80[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Stack_80[4]._M_use_count = 0;
  p_Stack_80[4]._M_weak_count = 0;
  p_Stack_80[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Stack_80[5]._M_use_count = 0;
  p_Stack_80[5]._M_weak_count = 0;
  p_Stack_80[6]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Stack_80[6]._M_use_count = 0;
  p_Stack_80[6]._M_weak_count = 0;
  p_Stack_80[7]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Stack_80[7]._M_use_count = 0;
  p_Stack_80[7]._M_weak_count = 0;
  p_Stack_80[1]._vptr__Sp_counted_base = (_func_int **)&PTR_toString_abi_cxx11__00167e50;
  p_Stack_80[2]._M_use_count = 0x3f800000;
  p_Stack_80[2]._M_weak_count = 0x3f800000;
  *(undefined4 *)&p_Stack_80[3]._vptr__Sp_counted_base = 0x3f800000;
  p_Stack_80[3]._M_use_count = 0;
  p_Stack_80[3]._M_weak_count = 0;
  p_Stack_80[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Stack_80[4]._M_use_count = 0;
  p_Stack_80[4]._M_weak_count = 0;
  p_Stack_80[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Stack_80[5]._M_use_count = 0;
  p_Stack_80[5]._M_weak_count = 0;
  p_Stack_80[6]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Stack_80[6]._M_use_count = 0x3f800000;
  p_Stack_80[6]._M_weak_count = 0x3f800000;
  p_Stack_80[7]._vptr__Sp_counted_base = (_func_int **)0x3f8000003f800000;
  p_Stack_80[7]._M_use_count = 0x3f800000;
  p_Stack_80[7]._M_weak_count = 0x3f800000;
  std::__shared_ptr<pbrt::MixTexture,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<pbrt::MixTexture,pbrt::MixTexture>
            ((__shared_ptr<pbrt::MixTexture,(__gnu_cxx::_Lock_policy)2> *)&local_88,
             (MixTexture *)local_88);
  lVar2 = *in_RDX;
  paVar1 = &local_a8.field_2;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"amount","");
  bVar6 = syntactic::ParamSet::hasParam3f((ParamSet *)(lVar2 + 8),&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  peVar3 = local_88;
  lVar2 = *in_RDX;
  if (bVar6) {
    local_a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"amount","");
    syntactic::ParamSet::getParam3f((ParamSet *)(lVar2 + 8),(float *)&peVar3->cameras,&local_a8);
  }
  else {
    local_a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"amount","");
    bVar6 = syntactic::ParamSet::hasParam1f((ParamSet *)(lVar2 + 8),&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (bVar6) {
      lVar2 = *in_RDX;
      local_a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"amount","");
      fVar8 = syntactic::ParamSet::getParam1f((ParamSet *)(lVar2 + 8),&local_a8,0.0);
      *(float *)&(local_88->cameras).
                 super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                 ._M_impl.super__Vector_impl_data._M_start = fVar8;
      *(float *)((long)&(local_88->cameras).
                        super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 4) = fVar8;
      *(float *)&(local_88->cameras).
                 super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish = fVar8;
    }
    else {
      lVar2 = *in_RDX;
      local_a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"amount","");
      syntactic::ParamSet::getParamTexture
                ((ParamSet *)&stack0xffffffffffffffc0,(string *)(lVar2 + 8));
      findOrCreateTexture((SemanticParser *)local_78,in);
      uVar5 = local_78._8_8_;
      uVar4 = local_78._0_8_;
      local_78._0_8_ = (element_type *)0x0;
      local_78._8_8_ = (element_type *)0x0;
      this_01 = (local_88->film).super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      *(undefined8 *)
       ((long)&(local_88->cameras).
               super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
               ._M_impl.super__Vector_impl_data + 0x10) = uVar4;
      (local_88->film).super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)uVar5;
      if (this_01 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
      }
      if ((element_type *)local_78._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
      }
      if (local_38 != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  lVar2 = *in_RDX;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"tex1","");
  bVar6 = syntactic::ParamSet::hasParamTexture((ParamSet *)(lVar2 + 8),&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if (bVar6) {
    lVar2 = *in_RDX;
    local_a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"tex1","");
    syntactic::ParamSet::getParamTexture((ParamSet *)&stack0xffffffffffffffb0,(string *)(lVar2 + 8))
    ;
    findOrCreateTexture((SemanticParser *)local_78,in);
    uVar5 = local_78._8_8_;
    uVar4 = local_78._0_8_;
    local_78._0_8_ = (element_type *)0x0;
    local_78._8_8_ = (element_type *)0x0;
    this_00 = (local_88->sampler).super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    (local_88->film).super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
    (local_88->sampler).super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar5;
    if (this_00 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
    }
    if ((element_type *)local_78._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
    }
    if (local_48 != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48);
    }
  }
  else {
    lVar2 = *in_RDX;
    local_a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"tex1","");
    bVar6 = syntactic::ParamSet::hasParam3f((ParamSet *)(lVar2 + 8),&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    peVar3 = local_88;
    lVar2 = *in_RDX;
    if (bVar6) {
      local_a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"tex1","");
      syntactic::ParamSet::getParam3f
                ((ParamSet *)(lVar2 + 8),
                 (float *)&(peVar3->integrator).
                           super___shared_ptr<pbrt::Integrator,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount,&local_a8);
    }
    else {
      local_a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"tex1","");
      fVar8 = syntactic::ParamSet::getParam1f((ParamSet *)(lVar2 + 8),&local_a8,0.0);
      *(float *)&(local_88->integrator).
                 super___shared_ptr<pbrt::Integrator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = fVar8;
      *(float *)((long)&(local_88->integrator).
                        super___shared_ptr<pbrt::Integrator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                        ._M_pi + 4) = fVar8;
      *(float *)&(local_88->pixelFilter).
                 super___shared_ptr<pbrt::PixelFilter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = fVar8;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  lVar2 = *in_RDX;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"tex2","");
  bVar6 = syntactic::ParamSet::hasParamTexture((ParamSet *)(lVar2 + 8),&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if (bVar6) {
    lVar2 = *in_RDX;
    local_a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"tex2","");
    syntactic::ParamSet::getParamTexture((ParamSet *)(local_78 + 0x18),(string *)(lVar2 + 8));
    SVar9 = findOrCreateTexture((SemanticParser *)local_78,in);
    uVar5 = local_78._8_8_;
    uVar4 = local_78._0_8_;
    _Var7 = SVar9.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    local_78._0_8_ = (element_type *)0x0;
    local_78._8_8_ = (element_type *)0x0;
    this_02 = (local_88->integrator).
              super___shared_ptr<pbrt::Integrator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (local_88->sampler).super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
    (local_88->integrator).super___shared_ptr<pbrt::Integrator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar5;
    if (this_02 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02);
      _Var7._M_pi = extraout_RDX;
    }
    if ((element_type *)local_78._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
      _Var7._M_pi = extraout_RDX_00;
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
      _Var7._M_pi = extraout_RDX_01;
    }
  }
  else {
    lVar2 = *in_RDX;
    local_a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"tex2","");
    bVar6 = syntactic::ParamSet::hasParam3f((ParamSet *)(lVar2 + 8),&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    peVar3 = local_88;
    lVar2 = *in_RDX;
    if (bVar6) {
      local_a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"tex2","");
      syntactic::ParamSet::getParam3f
                ((ParamSet *)(lVar2 + 8),
                 (float *)((long)&(peVar3->pixelFilter).
                                  super___shared_ptr<pbrt::PixelFilter,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr + 4),&local_a8);
      _Var7._M_pi = extraout_RDX_02;
    }
    else {
      local_a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"tex2","");
      fVar8 = syntactic::ParamSet::getParam1f((ParamSet *)(lVar2 + 8),&local_a8,0.0);
      *(float *)((long)&(local_88->pixelFilter).
                        super___shared_ptr<pbrt::PixelFilter,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4
                ) = fVar8;
      *(float *)&(local_88->pixelFilter).
                 super___shared_ptr<pbrt::PixelFilter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = fVar8;
      *(float *)((long)&(local_88->pixelFilter).
                        super___shared_ptr<pbrt::PixelFilter,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 4) = fVar8;
      _Var7._M_pi = extraout_RDX_03;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    _Var7._M_pi = extraout_RDX_04;
  }
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_88;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_80;
  SVar9.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  SVar9.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SP)SVar9.super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Texture::SP SemanticParser::createTexture_mix(pbrt::syntactic::Texture::SP in)
  {
    MixTexture::SP tex = std::make_shared<MixTexture>();

    if (in->hasParam3f("amount"))
      in->getParam3f(&tex->amount.x,"amount");
    else if (in->hasParam1f("amount"))
      tex->amount = vec3f(in->getParam1f("amount"));
    else 
      tex->map_amount = findOrCreateTexture(in->getParamTexture("amount"));
          
    if (in->hasParamTexture("tex1"))
      tex->tex1 = findOrCreateTexture(in->getParamTexture("tex1"));
    else if (in->hasParam3f("tex1"))
      in->getParam3f(&tex->scale1.x,"tex1");
    else
      tex->scale1 = vec3f(in->getParam1f("tex1"));
          
    if (in->hasParamTexture("tex2"))
      tex->tex2 = findOrCreateTexture(in->getParamTexture("tex2"));
    else if (in->hasParam3f("tex2"))
      in->getParam3f(&tex->scale2.x,"tex2");
    else
      tex->scale2 = vec3f(in->getParam1f("tex2"));
    return tex;
  }